

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void BoostLexicalCastOnStack(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  int *arg;
  rep rVar3;
  undefined1 local_1410 [8];
  buf_t buf;
  result_type i;
  uint _i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  uniform_int_distribution<int> local_13a8;
  uniform_int_distribution<int> _dist;
  random_device _rdev;
  int _imax;
  int _imin;
  ResultType _result;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"boost::lexical_cast on stack");
  poVar2 = std::operator<<(poVar2,"... ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::random_device::random_device((random_device *)&_dist);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13a8,-0x80000000,0x7fffffff);
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&i,
             (duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  buf._M_elems[0x3c] = '\0';
  buf._M_elems[0x3d] = '\0';
  buf._M_elems[0x3e] = '\0';
  buf._M_elems[0x3f] = '\0';
  for (; (uint)buf._M_elems._60_4_ < 10000000; buf._M_elems._60_4_ = buf._M_elems._60_4_ + 1) {
    buf._M_elems._56_4_ =
         std::uniform_int_distribution<int>::operator()(&local_13a8,(random_device *)&_dist);
    boost::lexical_cast<std::array<char,64ul>,int>
              ((array<char,_64UL> *)local_1410,(boost *)(buf._M_elems + 0x38),arg);
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&i);
  std::random_device::~random_device((random_device *)&_dist);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BoostLexicalCastOnStack()
{
    typedef std::array<char, 64> buf_t;
    RANDOM_PROFILING_BEGIN("boost::lexical_cast on stack")
    buf_t buf = boost::lexical_cast<buf_t>(i);
    RANDOM_PROFILING_END()
}